

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmmaparena.h
# Opt level: O3

void * __thiscall cookmem::MmapArena::getSegment(MmapArena *this,size_t *size)

{
  ulong uVar1;
  void *pvVar2;
  ulong __len;
  
  uVar1 = this->m_minSize;
  __len = *size;
  if (*size < uVar1) {
    *size = uVar1;
    __len = uVar1;
  }
  pvVar2 = mmap((void *)0x0,__len,this->m_prot,this->m_flag,-1,0);
  if (pvVar2 == (void *)0xffffffffffffffff) {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

void*
    getSegment (std::size_t& size)
    {
        if (size < m_minSize)
        {
            size = m_minSize;
        }
        void* ptr = mmap(nullptr, size, m_prot, m_flag, -1, 0);
        if (ptr == MAP_FAILED)
        {
            return nullptr;
        }
        return ptr;
    }